

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.hpp
# Opt level: O2

string * __thiscall
History::get_last_cmd(string *__return_storage_ptr__,History *this,string *sess_id,string *pwd)

{
  bool bVar1;
  socklen_t __len;
  Query query;
  Query local_70;
  string local_40;
  
  __len = (socklen_t)pwd;
  sqlite::Query::Query(&local_70,&this->db,&(this->lcSch).select);
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_40);
  sqlite::Query::bind(&local_70,(int)this + 0x50,(sockaddr *)sess_id,__len);
  sqlite::Query::bind(&local_70,(int)this + 0xe0,(sockaddr *)pwd,__len);
  while( true ) {
    bVar1 = sqlite::Query::exec_step(&local_70);
    if (!bVar1) break;
    sqlite::Query::get_string_abi_cxx11_
              (&local_40,&local_70,
               (this->lcSch).super_LastCommandsSchemaColumnsList.cmd.super_ColumnBase.pos);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  std::unique_ptr<sqlite3_stmt,_std::function<void_(sqlite3_stmt_*)>_>::~unique_ptr(&local_70.stmt);
  return __return_storage_ptr__;
}

Assistant:

std::string get_last_cmd(const std::string& sess_id, const std::string& pwd) {
    sqlite::Query query(db, lcSch.select);
    std::string cmd = "";

    query.bind(lcSch.sess_id.bName,
               sess_id);  // TODO(dkolmakov): Implement type safe binding
    query.bind(lcSch.pwd.bName, pwd);

    while (query.exec_step()) {
      cmd = query.get_string(lcSch.cmd.getPos());
    }

    return cmd;
  }